

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

StructurePtr __thiscall soul::Module::Structs::find(Structs *this,string_view name)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  RefCountedPtr<soul::Structure> *pRVar2;
  Structure *this_00;
  string *this_01;
  char *in_RCX;
  RefCountedPtr<soul::Structure> *s;
  RefCountedPtr<soul::Structure> *__end1;
  RefCountedPtr<soul::Structure> *__begin1;
  ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL> *__range1;
  Structs *this_local;
  string_view name_local;
  
  __end1 = ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL>::begin
                     ((ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL> *)
                      name._M_len);
  pRVar2 = ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL>::end
                     ((ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL> *)
                      name._M_len);
  while( true ) {
    if (__end1 == pRVar2) {
      memset(this,0,8);
      RefCountedPtr<soul::Structure>::RefCountedPtr((RefCountedPtr<soul::Structure> *)this);
      return (StructurePtr)(Structure *)this;
    }
    this_00 = RefCountedPtr<soul::Structure>::operator->(__end1);
    this_01 = Structure::getName_abi_cxx11_(this_00);
    __y = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    __x._M_str = in_RCX;
    __x._M_len = (size_t)name._M_str;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  RefCountedPtr<soul::Structure>::RefCountedPtr((RefCountedPtr<soul::Structure> *)this,__end1);
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr Module::Structs::find (std::string_view name) const noexcept
{
    for (auto& s : structs)
        if (name == s->getName())
            return s;

    return {};
}